

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

void free_descriptor(DESCRIPTOR_DATA *d)

{
  DESCRIPTOR_DATA *in_RDI;
  char *in_stack_fffffffffffffff0;
  
  if ((in_RDI != (DESCRIPTOR_DATA *)0x0) && ((in_RDI->valid & 1U) != 0)) {
    free_pstring(in_stack_fffffffffffffff0);
    if ((in_RDI->outbuf != (char *)0x0) && (in_RDI->outbuf != (char *)0x0)) {
      operator_delete__(in_RDI->outbuf);
    }
    in_RDI->valid = false;
    in_RDI->next = descriptor_free;
    descriptor_free = in_RDI;
  }
  return;
}

Assistant:

void free_descriptor(DESCRIPTOR_DATA *d)
{
	if (!(d != nullptr && d->valid))
		return;

	free_pstring(d->host);

	if (d->outbuf)
		delete[] d->outbuf;

	d->valid = false;
	d->next = descriptor_free;
	descriptor_free = d;
}